

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zuncompress.c
# Opt level: O1

int zuncompress2mem(char *filename,FILE *indiskfile,char **buffptr,size_t *buffsize,
                   _func_void_ptr_void_ptr_size_t *mem_realloc,size_t *filesize,int *status)

{
  uch uVar1;
  int iVar2;
  ulong uVar4;
  char magic [2];
  int iVar3;
  
  iVar2 = *status;
  if (iVar2 < 1) {
    ifname[0] = '\0';
    iVar3 = 0x306f10;
    strncat(ifname,filename,0x7f);
    inptr = 0;
    insize = 0;
    bytes_out = 0;
    bytes_in = 0;
    ifd = indiskfile;
    memptr = buffptr;
    memsize = buffsize;
    realloc_fn = mem_realloc;
    iVar2 = fill_inbuf(iVar3);
    uVar4 = (ulong)inptr;
    if (inptr < insize) {
      inptr = inptr + 1;
      uVar1 = inbuf[uVar4];
    }
    else {
      iVar3 = fill_inbuf(iVar3);
      uVar1 = (uch)iVar3;
    }
    if (CONCAT11(uVar1,(char)iVar2) == -0x62e1) {
      work = unlzw;
      iVar2 = unlzw(ifd,ofd);
      if (iVar2 != 0) {
        *status = 0x19e;
      }
      if (filesize != (size_t *)0x0) {
        *filesize = bytes_out;
      }
      iVar2 = *status;
    }
    else {
      ffpmsg(ifname);
      ffpmsg("ERROR: input .Z file is in unrecognized compression format.\n");
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int zuncompress2mem(char *filename,  /* name of input file                 */
             FILE *indiskfile,     /* I - file pointer                        */
             char **buffptr,   /* IO - memory pointer                     */
             size_t *buffsize,   /* IO - size of buffer, in bytes           */
             void *(*mem_realloc)(void *p, size_t newsize), /* function     */
             size_t *filesize,   /* O - size of file, in bytes              */
             int *status)        /* IO - error status                       */

/*
  Uncompress the file into memory.  Fill whatever amount of memory has
  already been allocated, then realloc more memory, using the supplied
  input function, if necessary.
*/
{
    char magic[2]; /* magic header */

    if (*status > 0)
        return(*status);

    /*  save input parameters into global variables */
    ifname[0] = '\0';
    strncat(ifname, filename, 127);
    ifd = indiskfile;
    memptr = (void **) buffptr;
    memsize = buffsize;
    realloc_fn = mem_realloc;

    /* clear input and output buffers */

    insize = inptr = 0;
    bytes_in = bytes_out = 0L;

    magic[0] = (char)get_byte();
    magic[1] = (char)get_byte();

    if (memcmp(magic, LZW_MAGIC, 2) != 0) {
      error("ERROR: input .Z file is in unrecognized compression format.\n");
      return(-1);
    }

    work = unlzw;
    method = COMPRESSED;
    last_member = 1;

    /* do the uncompression */
    if ((*work)(ifd, ofd) != OK) {
        method = -1; /* force cleanup */
        *status = 414;    /* report some sort of decompression error */
    }

    if (filesize)  *filesize = bytes_out;

    return(*status);
}